

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

UploadSampleAnalyzeResult
deqp::gles3::Performance::anon_unknown_1::
analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
          (TestLog *log,
          vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
          *samples,bool logBucketPerformance)

{
  pointer *ppUVar1;
  undefined8 uVar2;
  uint uVar3;
  TestLog *pTVar4;
  uint uVar5;
  SampleBuilder *pSVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  pointer pUVar10;
  string *psVar11;
  ulong uVar12;
  offset_in_SampleType_to_deUint64 in_RCX;
  LogNumber<float> *pLVar13;
  int numBytes;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  long lVar14;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *__buf_13;
  void *__buf_14;
  void *__buf_15;
  void *__buf_16;
  void *__buf_17;
  void *__buf_18;
  void *__buf_19;
  void *__buf_20;
  void *__buf_21;
  void *__buf_22;
  void *__buf_23;
  void *__buf_24;
  void *__buf_25;
  void *__buf_26;
  void *__buf_27;
  void *__buf_28;
  void *__buf_29;
  void *__buf_30;
  void *__buf_31;
  void *__buf_32;
  void *__buf_33;
  void *__buf_34;
  void *__buf_35;
  void *__buf_36;
  void *__buf_37;
  void *__buf_38;
  void *__buf_39;
  void *__buf_40;
  void *__buf_41;
  void *__buf_42;
  void *__buf_43;
  void *__buf_44;
  void *__buf_45;
  void *__buf_46;
  void *__buf_47;
  void *__buf_48;
  void *__buf_49;
  void *__buf_50;
  void *__buf_51;
  void *__buf_52;
  void *__buf_53;
  void *__buf_54;
  void *__buf_55;
  void *__buf_56;
  void *__buf_57;
  void *__buf_58;
  void *__buf_59;
  void *__buf_60;
  void *__buf_61;
  void *__buf_62;
  void *__buf_63;
  void *__buf_64;
  void *__buf_65;
  void *__buf_66;
  void *__buf_67;
  void *__buf_68;
  void *__buf_69;
  void *__buf_70;
  void *__buf_71;
  void *__buf_72;
  uint uVar15;
  long lVar16;
  int iVar17;
  undefined8 *puVar18;
  pointer pUVar19;
  pointer this;
  offset_in_SampleType_to_deUint64 in_R9;
  ulong uVar20;
  long lVar21;
  size_t __n;
  long *plVar22;
  byte bVar23;
  uint uVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  UploadSampleAnalyzeResult UVar30;
  undefined1 auVar31 [12];
  allocator<char> local_c0a;
  allocator<char> local_c09;
  allocator<char> local_c08;
  allocator<char> local_c07;
  allocator<char> local_c06;
  allocator<char> local_c05;
  allocator<char> local_c04;
  allocator<char> local_c03;
  allocator<char> local_c02;
  allocator<char> local_c01;
  allocator<char> local_c00;
  allocator<char> local_bff;
  allocator<char> local_bfe;
  allocator<char> local_bfd;
  allocator<char> local_bfc;
  allocator<char> local_bfb;
  allocator<char> local_bfa;
  allocator<char> local_bf9;
  allocator<char> local_bf8;
  allocator<char> local_bf7;
  allocator<char> local_bf6;
  allocator<char> local_bf5;
  allocator<char> local_bf4;
  allocator<char> local_bf3;
  allocator<char> local_bf2;
  allocator<char> local_bf1;
  allocator<char> local_bf0;
  allocator<char> local_bef;
  allocator<char> local_bee;
  allocator<char> local_bed;
  allocator<char> local_bec;
  allocator<char> local_beb;
  allocator<char> local_bea;
  allocator<char> local_be9;
  string local_be8;
  string local_bc8;
  string local_ba8;
  string local_b88;
  string local_b68;
  string local_b48;
  string local_b28;
  allocator<char> local_b02;
  allocator<char> local_b01;
  string local_b00;
  long local_ae0;
  undefined1 local_ad8 [16];
  string local_ac8;
  undefined1 local_aa8 [104];
  ScopedLogSection section_1;
  StatsType stats;
  string local_9a0;
  string local_980;
  string local_960;
  string local_940;
  string local_920;
  string local_900;
  string local_8e0;
  string local_8c0;
  string local_8a0;
  string local_880;
  LogNumber<float> local_860;
  pointer local_7f8;
  long local_7f0;
  string local_7e8;
  string local_7c8;
  string local_7a8;
  string local_788;
  LogNumber<float> local_768;
  float local_700;
  float local_6fc;
  float local_6f8;
  float local_6f4;
  float local_6f0;
  float local_6ec;
  float local_6e8;
  float local_6e4;
  LogNumber<float> local_6e0;
  LogNumber<float> local_678;
  LogNumber<float> local_610;
  LogNumber<float> local_5a8;
  LogNumber<float> local_540;
  LogNumber<float> local_4d8;
  LogNumber<float> local_470;
  LineParametersWithConfidence contributionFitting;
  LineParametersWithConfidence theilSenFitting;
  LogNumber<float> local_380;
  undefined1 local_318 [16];
  TestLog *local_300;
  string local_2f8;
  ScopedLogSection section;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  ScopedLogSection section_3;
  string local_1d8;
  string local_1b8;
  string local_198;
  vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
  buckets [4];
  string local_118;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  StatsType resultStats;
  
  local_ad8._8_8_ = local_ad8._0_8_;
  bVar23 = 0;
  (anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>>
            (&theilSenFitting,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
              *)0x30,in_RCX);
  calculateSampleStatistics(&resultStats,&theilSenFitting,samples);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stats,"Samples",(allocator<char> *)&local_860);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_aa8,"Samples",(allocator<char> *)&local_768);
  psVar11 = (string *)local_aa8;
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)&stats,psVar11);
  std::__cxx11::string::~string((string *)local_aa8);
  std::__cxx11::string::~string((string *)&stats);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6e0,"Samples",(allocator<char> *)&local_198);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4d8,"Samples",(allocator<char> *)&local_218);
  tcu::LogSampleList::LogSampleList((LogSampleList *)&local_678,&local_6e0.m_name,&local_4d8.m_name)
  ;
  iVar17 = (int)log;
  tcu::LogSampleList::write((LogSampleList *)&local_678,iVar17,__buf,(size_t)psVar11);
  tcu::TestLog::startSampleInfo(log);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&contributionFitting,"WrittenSize",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)buckets,"Written size",(allocator<char> *)&local_1b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b68,"bytes",(allocator<char> *)&local_258);
  psVar11 = &local_b68;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&stats,(string *)&contributionFitting,(string *)buckets,psVar11,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::LogValueInfo::write((LogValueInfo *)&stats,iVar17,__buf_00,(size_t)psVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b00,"BufferSize",(allocator<char> *)&local_278);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b88,"Buffer size",(allocator<char> *)&local_1d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bc8,"bytes",(allocator<char> *)&local_298);
  psVar11 = &local_bc8;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)local_aa8,&local_b00,&local_b88,psVar11,QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::LogValueInfo::write((LogValueInfo *)local_aa8,iVar17,__buf_01,(size_t)psVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b28,"TotalTime",(allocator<char> *)&section_3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ba8,"Total time",(allocator<char> *)&local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_be8,"us",(allocator<char> *)&section_1);
  psVar11 = &local_be8;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_860,&local_b28,&local_ba8,psVar11,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_860,iVar17,__buf_02,(size_t)psVar11);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b48,"AllocTime",&local_bf9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ac8,"Alloc time",&local_bfa);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_880,"us",&local_bfb);
  psVar11 = &local_880;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_768,&local_b48,&local_ac8,psVar11,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_768,iVar17,__buf_03,(size_t)psVar11);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a0,"MapTime",&local_bfc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_788,"Map time",&local_bfd);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c0,"us",&local_bfe);
  psVar11 = &local_8c0;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_610,&local_8a0,&local_788,psVar11,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_610,iVar17,__buf_04,(size_t)psVar11);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8e0,"UnmapTime",&local_bff);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7a8,"Unmap time",&local_c00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_900,"us",&local_c01);
  psVar11 = &local_900;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_380,&local_8e0,&local_7a8,psVar11,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_380,iVar17,__buf_05,(size_t)psVar11);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_920,"WriteTime",&local_c02);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7c8,"Write time",&local_c03);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_940,"us",&local_c04);
  psVar11 = &local_940;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_5a8,&local_920,&local_7c8,psVar11,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_5a8,iVar17,__buf_06,(size_t)psVar11);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_960,"FlushTime",&local_c05);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7e8,"Flush time",&local_c06);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_980,"us",&local_c07);
  psVar11 = &local_980;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_540,&local_960,&local_7e8,psVar11,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_540,iVar17,__buf_07,(size_t)psVar11);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9a0,"FitResidual",&local_c08);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"Fit residual",&local_c09)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"us",&local_c0a);
  psVar11 = &local_2f8;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_470,&local_9a0,&local_2b8,psVar11,QP_SAMPLE_VALUE_TAG_RESPONSE);
  local_ad8._0_8_ = samples;
  tcu::LogValueInfo::write((LogValueInfo *)&local_470,iVar17,__buf_08,(size_t)psVar11);
  tcu::TestLog::endSampleInfo(log);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_470);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_9a0);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_540);
  std::__cxx11::string::~string((string *)&local_980);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::~string((string *)&local_960);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_5a8);
  std::__cxx11::string::~string((string *)&local_940);
  std::__cxx11::string::~string((string *)&local_7c8);
  std::__cxx11::string::~string((string *)&local_920);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_380);
  std::__cxx11::string::~string((string *)&local_900);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::__cxx11::string::~string((string *)&local_8e0);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_610);
  std::__cxx11::string::~string((string *)&local_8c0);
  std::__cxx11::string::~string((string *)&local_788);
  std::__cxx11::string::~string((string *)&local_8a0);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_768);
  std::__cxx11::string::~string((string *)&local_880);
  std::__cxx11::string::~string((string *)&local_ac8);
  std::__cxx11::string::~string((string *)&local_b48);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_860);
  std::__cxx11::string::~string((string *)&local_be8);
  std::__cxx11::string::~string((string *)&local_ba8);
  std::__cxx11::string::~string((string *)&local_b28);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)local_aa8);
  std::__cxx11::string::~string((string *)&local_bc8);
  std::__cxx11::string::~string((string *)&local_b88);
  std::__cxx11::string::~string((string *)&local_b00);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&stats);
  std::__cxx11::string::~string((string *)&local_b68);
  std::__cxx11::string::~string((string *)buckets);
  std::__cxx11::string::~string((string *)&contributionFitting);
  tcu::LogSampleList::~LogSampleList((LogSampleList *)&local_678);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::__cxx11::string::~string((string *)&local_6e0);
  lVar21 = 0;
  lVar16 = 0;
  while( true ) {
    lVar14 = *(long *)local_ad8._0_8_;
    if ((int)((*(long *)(local_ad8._0_8_ + 8) - lVar14) / 0x48) <= lVar16) break;
    uVar12 = *(ulong *)(lVar14 + 0x40 + lVar21);
    local_ae0 = CONCAT44(local_ae0._4_4_,
                         (float)*(int *)(lVar14 + 8 + lVar21) * theilSenFitting.coefficient +
                         theilSenFitting.offset);
    stats._8_16_ = ZEXT416(0);
    stats.unmap.maxTime = 0.0;
    stats.unmap.medianTime = 0.0;
    stats.map._0_8_ = log;
    pSVar6 = tcu::SampleBuilder::operator<<((SampleBuilder *)&stats,*(int *)(lVar14 + 8 + lVar21));
    uVar2 = local_ad8._0_8_;
    pSVar6 = tcu::SampleBuilder::operator<<(pSVar6,*(int *)(*(long *)local_ad8._0_8_ + lVar21));
    pSVar6 = tcu::SampleBuilder::operator<<(pSVar6,*(int *)(*(long *)uVar2 + 0x38 + lVar21));
    pSVar6 = tcu::SampleBuilder::operator<<(pSVar6,*(int *)(*(long *)uVar2 + 0x30 + lVar21));
    pSVar6 = tcu::SampleBuilder::operator<<(pSVar6,*(int *)(*(long *)uVar2 + 0x10 + lVar21));
    pSVar6 = tcu::SampleBuilder::operator<<(pSVar6,*(int *)(*(long *)uVar2 + 0x18 + lVar21));
    pSVar6 = tcu::SampleBuilder::operator<<(pSVar6,*(int *)(*(long *)uVar2 + 0x20 + lVar21));
    pSVar6 = tcu::SampleBuilder::operator<<(pSVar6,*(int *)(*(long *)uVar2 + 0x28 + lVar21));
    pSVar6 = tcu::SampleBuilder::operator<<(pSVar6,(float)uVar12 - (float)local_ae0);
    tcu::SampleBuilder::operator<<(pSVar6,(EndSampleToken *)&tcu::TestLog::EndSample);
    std::_Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>::
    ~_Vector_base((_Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>
                   *)&stats.map.medianTime);
    lVar16 = lVar16 + 1;
    lVar21 = lVar21 + 0x48;
  }
  tcu::TestLog::endSampleList(log);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  buckets[3].
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  buckets[3].
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buckets[2].
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buckets[3].
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  buckets[2].
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  buckets[2].
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  buckets[1].
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  buckets[1].
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buckets[0].
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buckets[1].
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  buckets[0].
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  buckets[0].
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar16 = *(long *)local_ad8._0_8_;
  lVar21 = *(long *)(local_ad8._0_8_ + 8);
  lVar14 = (long)(int)((lVar21 - lVar16) / 0x48);
  lVar7 = 0;
  if (lVar14 < 1) {
    lVar14 = lVar7;
  }
  uVar15 = 0;
  uVar24 = 0;
  uVar5 = 0;
  for (; lVar14 * 0x48 - lVar7 != 0; lVar7 = lVar7 + 0x48) {
    uVar3 = *(uint *)(lVar16 + 4 + lVar7);
    in_R9 = (offset_in_SampleType_to_deUint64)uVar3;
    if ((int)uVar3 < (int)uVar15 || uVar15 == 0) {
      uVar5 = uVar24;
      uVar15 = uVar3;
    }
    if ((int)uVar5 < (int)uVar3 || uVar5 == 0) {
      uVar5 = uVar3;
      uVar24 = uVar3;
    }
  }
  fVar25 = (float)(int)(uVar24 - uVar15);
  lVar14 = 0;
  lVar7 = 0;
  local_318._0_4_ = uVar15;
  plVar22 = (long *)local_ad8._0_8_;
  local_300 = log;
  do {
    pTVar4 = local_300;
    if ((int)((lVar21 - lVar16) / 0x48) <= lVar7) {
      lVar16 = 0;
      while (iVar17 = (int)pTVar4, lVar16 != 4) {
        if (buckets[lVar16].
            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            buckets[lVar16].
            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          lVar16 = lVar16 + 1;
        }
        else {
          calculateSampleStatistics(&stats,&theilSenFitting,buckets + lVar16);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_aa8,"BufferSizeRange",(allocator<char> *)&local_380);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_860,"Transfer performance with buffer size in range [",
                     (allocator<char> *)&local_5a8);
          (anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
                    (&local_768.m_name,
                     (_anonymous_namespace_ *)
                     (ulong)(uint)((int)((float)(int)lVar16 * 0.25 * fVar25) + local_318._0_4_),
                     numBytes);
          auVar31 = std::__cxx11::string::append((char *)&local_768);
          lVar16 = lVar16 + 1;
          (anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
                    (&local_610.m_name,
                     (_anonymous_namespace_ *)
                     (ulong)(uint)((int)((float)(int)lVar16 * 0.25 * fVar25) + local_318._0_4_),
                     auVar31._8_4_);
          std::__cxx11::string::append((char *)&local_610);
          std::__cxx11::string::append(auVar31._0_8_);
          psVar11 = (string *)std::__cxx11::string::append((string *)&local_860);
          tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar4,(string *)local_aa8,psVar11);
          std::__cxx11::string::~string((string *)&local_610);
          std::__cxx11::string::~string((string *)&local_768);
          std::__cxx11::string::~string((string *)&local_860);
          std::__cxx11::string::~string((string *)local_aa8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5a8,"MapRangeMin",(allocator<char> *)&local_ac8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_540,"MapRange: Min time",(allocator<char> *)&local_880);
          pLVar13 = &local_470;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)pLVar13,"us",(allocator<char> *)&local_8a0);
          tcu::LogNumber<float>::LogNumber
                    ((LogNumber<float> *)local_aa8,&local_5a8.m_name,&local_540.m_name,
                     &pLVar13->m_name,QP_KEY_TAG_TIME,stats.map.minTime);
          tcu::LogNumber<float>::write
                    ((LogNumber<float> *)local_aa8,iVar17,__buf_09,(size_t)pLVar13);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_678,"MapRangeMax",(allocator<char> *)&local_788);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6e0,"MapRange: Max time",(allocator<char> *)&local_8c0);
          pLVar13 = &local_4d8;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)pLVar13,"us",(allocator<char> *)&local_8e0);
          tcu::LogNumber<float>::LogNumber
                    (&local_860,&local_678.m_name,&local_6e0.m_name,&pLVar13->m_name,QP_KEY_TAG_TIME
                     ,stats.map.maxTime);
          tcu::LogNumber<float>::write(&local_860,iVar17,__buf_10,(size_t)pLVar13);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&contributionFitting,"MapRangeMin90",(allocator<char> *)&local_7a8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b68,"MapRange: 90%-Min time",(allocator<char> *)&local_900);
          psVar11 = &local_b00;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar11,"us",(allocator<char> *)&local_920);
          tcu::LogNumber<float>::LogNumber
                    (&local_768,(string *)&contributionFitting,&local_b68,psVar11,QP_KEY_TAG_TIME,
                     stats.map.min2DecileTime);
          tcu::LogNumber<float>::write(&local_768,iVar17,__buf_11,(size_t)psVar11);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b88,"MapRangeMax90",(allocator<char> *)&local_7c8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_bc8,"MapRange: 90%-Max time",(allocator<char> *)&local_940);
          psVar11 = &local_b28;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar11,"us",(allocator<char> *)&local_960);
          tcu::LogNumber<float>::LogNumber
                    (&local_610,&local_b88,&local_bc8,psVar11,QP_KEY_TAG_TIME,
                     stats.map.max9DecileTime);
          tcu::LogNumber<float>::write(&local_610,iVar17,__buf_12,(size_t)psVar11);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_ba8,"MapRangeMedian",(allocator<char> *)&local_7e8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_be8,"MapRange: Median time",(allocator<char> *)&local_980);
          psVar11 = &local_b48;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar11,"us",(allocator<char> *)&local_9a0);
          tcu::LogNumber<float>::LogNumber
                    (&local_380,&local_ba8,&local_be8,psVar11,QP_KEY_TAG_TIME,stats.map.medianTime);
          tcu::LogNumber<float>::write(&local_380,iVar17,__buf_13,(size_t)psVar11);
          tcu::LogNumber<float>::~LogNumber(&local_380);
          std::__cxx11::string::~string((string *)&local_b48);
          std::__cxx11::string::~string((string *)&local_be8);
          std::__cxx11::string::~string((string *)&local_ba8);
          tcu::LogNumber<float>::~LogNumber(&local_610);
          std::__cxx11::string::~string((string *)&local_b28);
          std::__cxx11::string::~string((string *)&local_bc8);
          std::__cxx11::string::~string((string *)&local_b88);
          tcu::LogNumber<float>::~LogNumber(&local_768);
          std::__cxx11::string::~string((string *)&local_b00);
          std::__cxx11::string::~string((string *)&local_b68);
          std::__cxx11::string::~string((string *)&contributionFitting);
          tcu::LogNumber<float>::~LogNumber(&local_860);
          std::__cxx11::string::~string((string *)&local_4d8);
          std::__cxx11::string::~string((string *)&local_6e0);
          std::__cxx11::string::~string((string *)&local_678);
          tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)local_aa8);
          std::__cxx11::string::~string((string *)&local_470);
          std::__cxx11::string::~string((string *)&local_540);
          std::__cxx11::string::~string((string *)&local_5a8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5a8,"UnmapMin",(allocator<char> *)&local_ac8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_540,"Unmap: Min time",(allocator<char> *)&local_880);
          pLVar13 = &local_470;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)pLVar13,"us",(allocator<char> *)&local_8a0);
          tcu::LogNumber<float>::LogNumber
                    ((LogNumber<float> *)local_aa8,&local_5a8.m_name,&local_540.m_name,
                     &pLVar13->m_name,QP_KEY_TAG_TIME,stats.unmap.minTime);
          tcu::LogNumber<float>::write
                    ((LogNumber<float> *)local_aa8,iVar17,__buf_14,(size_t)pLVar13);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_678,"UnmapMax",(allocator<char> *)&local_788);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6e0,"Unmap: Max time",(allocator<char> *)&local_8c0);
          pLVar13 = &local_4d8;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)pLVar13,"us",(allocator<char> *)&local_8e0);
          tcu::LogNumber<float>::LogNumber
                    (&local_860,&local_678.m_name,&local_6e0.m_name,&pLVar13->m_name,QP_KEY_TAG_TIME
                     ,stats.unmap.maxTime);
          tcu::LogNumber<float>::write(&local_860,iVar17,__buf_15,(size_t)pLVar13);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&contributionFitting,"UnmapMin90",(allocator<char> *)&local_7a8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b68,"Unmap: 90%-Min time",(allocator<char> *)&local_900);
          psVar11 = &local_b00;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar11,"us",(allocator<char> *)&local_920);
          tcu::LogNumber<float>::LogNumber
                    (&local_768,(string *)&contributionFitting,&local_b68,psVar11,QP_KEY_TAG_TIME,
                     stats.unmap.min2DecileTime);
          tcu::LogNumber<float>::write(&local_768,iVar17,__buf_16,(size_t)psVar11);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b88,"UnmapMax90",(allocator<char> *)&local_7c8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_bc8,"Unmap: 90%-Max time",(allocator<char> *)&local_940);
          psVar11 = &local_b28;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar11,"us",(allocator<char> *)&local_960);
          tcu::LogNumber<float>::LogNumber
                    (&local_610,&local_b88,&local_bc8,psVar11,QP_KEY_TAG_TIME,
                     stats.unmap.max9DecileTime);
          tcu::LogNumber<float>::write(&local_610,iVar17,__buf_17,(size_t)psVar11);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_ba8,"UnmapMedian",(allocator<char> *)&local_7e8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_be8,"Unmap: Median time",(allocator<char> *)&local_980);
          psVar11 = &local_b48;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar11,"us",(allocator<char> *)&local_9a0);
          tcu::LogNumber<float>::LogNumber
                    (&local_380,&local_ba8,&local_be8,psVar11,QP_KEY_TAG_TIME,stats.unmap.medianTime
                    );
          tcu::LogNumber<float>::write(&local_380,iVar17,__buf_18,(size_t)psVar11);
          tcu::LogNumber<float>::~LogNumber(&local_380);
          std::__cxx11::string::~string((string *)&local_b48);
          std::__cxx11::string::~string((string *)&local_be8);
          std::__cxx11::string::~string((string *)&local_ba8);
          tcu::LogNumber<float>::~LogNumber(&local_610);
          std::__cxx11::string::~string((string *)&local_b28);
          std::__cxx11::string::~string((string *)&local_bc8);
          std::__cxx11::string::~string((string *)&local_b88);
          tcu::LogNumber<float>::~LogNumber(&local_768);
          std::__cxx11::string::~string((string *)&local_b00);
          std::__cxx11::string::~string((string *)&local_b68);
          std::__cxx11::string::~string((string *)&contributionFitting);
          tcu::LogNumber<float>::~LogNumber(&local_860);
          std::__cxx11::string::~string((string *)&local_4d8);
          std::__cxx11::string::~string((string *)&local_6e0);
          std::__cxx11::string::~string((string *)&local_678);
          tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)local_aa8);
          std::__cxx11::string::~string((string *)&local_470);
          std::__cxx11::string::~string((string *)&local_540);
          std::__cxx11::string::~string((string *)&local_5a8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5a8,"WriteMin",(allocator<char> *)&local_ac8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_540,"Write: Min time",(allocator<char> *)&local_880);
          pLVar13 = &local_470;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)pLVar13,"us",(allocator<char> *)&local_8a0);
          tcu::LogNumber<float>::LogNumber
                    ((LogNumber<float> *)local_aa8,&local_5a8.m_name,&local_540.m_name,
                     &pLVar13->m_name,QP_KEY_TAG_TIME,stats.write.minTime);
          tcu::LogNumber<float>::write
                    ((LogNumber<float> *)local_aa8,iVar17,__buf_19,(size_t)pLVar13);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_678,"WriteMax",(allocator<char> *)&local_788);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6e0,"Write: Max time",(allocator<char> *)&local_8c0);
          pLVar13 = &local_4d8;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)pLVar13,"us",(allocator<char> *)&local_8e0);
          tcu::LogNumber<float>::LogNumber
                    (&local_860,&local_678.m_name,&local_6e0.m_name,&pLVar13->m_name,QP_KEY_TAG_TIME
                     ,stats.write.maxTime);
          tcu::LogNumber<float>::write(&local_860,iVar17,__buf_20,(size_t)pLVar13);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&contributionFitting,"WriteMin90",(allocator<char> *)&local_7a8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b68,"Write: 90%-Min time",(allocator<char> *)&local_900);
          psVar11 = &local_b00;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar11,"us",(allocator<char> *)&local_920);
          tcu::LogNumber<float>::LogNumber
                    (&local_768,(string *)&contributionFitting,&local_b68,psVar11,QP_KEY_TAG_TIME,
                     stats.write.min2DecileTime);
          tcu::LogNumber<float>::write(&local_768,iVar17,__buf_21,(size_t)psVar11);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b88,"WriteMax90",(allocator<char> *)&local_7c8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_bc8,"Write: 90%-Max time",(allocator<char> *)&local_940);
          psVar11 = &local_b28;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar11,"us",(allocator<char> *)&local_960);
          tcu::LogNumber<float>::LogNumber
                    (&local_610,&local_b88,&local_bc8,psVar11,QP_KEY_TAG_TIME,
                     stats.write.max9DecileTime);
          tcu::LogNumber<float>::write(&local_610,iVar17,__buf_22,(size_t)psVar11);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_ba8,"WriteMedian",(allocator<char> *)&local_7e8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_be8,"Write: Median time",(allocator<char> *)&local_980);
          psVar11 = &local_b48;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar11,"us",(allocator<char> *)&local_9a0);
          tcu::LogNumber<float>::LogNumber
                    (&local_380,&local_ba8,&local_be8,psVar11,QP_KEY_TAG_TIME,stats.write.medianTime
                    );
          tcu::LogNumber<float>::write(&local_380,iVar17,__buf_23,(size_t)psVar11);
          tcu::LogNumber<float>::~LogNumber(&local_380);
          std::__cxx11::string::~string((string *)&local_b48);
          std::__cxx11::string::~string((string *)&local_be8);
          std::__cxx11::string::~string((string *)&local_ba8);
          tcu::LogNumber<float>::~LogNumber(&local_610);
          std::__cxx11::string::~string((string *)&local_b28);
          std::__cxx11::string::~string((string *)&local_bc8);
          std::__cxx11::string::~string((string *)&local_b88);
          tcu::LogNumber<float>::~LogNumber(&local_768);
          std::__cxx11::string::~string((string *)&local_b00);
          std::__cxx11::string::~string((string *)&local_b68);
          std::__cxx11::string::~string((string *)&contributionFitting);
          tcu::LogNumber<float>::~LogNumber(&local_860);
          std::__cxx11::string::~string((string *)&local_4d8);
          std::__cxx11::string::~string((string *)&local_6e0);
          std::__cxx11::string::~string((string *)&local_678);
          tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)local_aa8);
          std::__cxx11::string::~string((string *)&local_470);
          std::__cxx11::string::~string((string *)&local_540);
          std::__cxx11::string::~string((string *)&local_5a8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5a8,"FlushMin",(allocator<char> *)&local_ac8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_540,"Flush: Min time",(allocator<char> *)&local_880);
          pLVar13 = &local_470;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)pLVar13,"us",(allocator<char> *)&local_8a0);
          tcu::LogNumber<float>::LogNumber
                    ((LogNumber<float> *)local_aa8,&local_5a8.m_name,&local_540.m_name,
                     &pLVar13->m_name,QP_KEY_TAG_TIME,stats.flush.minTime);
          tcu::LogNumber<float>::write
                    ((LogNumber<float> *)local_aa8,iVar17,__buf_24,(size_t)pLVar13);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_678,"FlushMax",(allocator<char> *)&local_788);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6e0,"Flush: Max time",(allocator<char> *)&local_8c0);
          pLVar13 = &local_4d8;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)pLVar13,"us",(allocator<char> *)&local_8e0);
          tcu::LogNumber<float>::LogNumber
                    (&local_860,&local_678.m_name,&local_6e0.m_name,&pLVar13->m_name,QP_KEY_TAG_TIME
                     ,stats.flush.maxTime);
          tcu::LogNumber<float>::write(&local_860,iVar17,__buf_25,(size_t)pLVar13);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&contributionFitting,"FlushMin90",(allocator<char> *)&local_7a8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b68,"Flush: 90%-Min time",(allocator<char> *)&local_900);
          psVar11 = &local_b00;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar11,"us",(allocator<char> *)&local_920);
          tcu::LogNumber<float>::LogNumber
                    (&local_768,(string *)&contributionFitting,&local_b68,psVar11,QP_KEY_TAG_TIME,
                     stats.flush.min2DecileTime);
          tcu::LogNumber<float>::write(&local_768,iVar17,__buf_26,(size_t)psVar11);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b88,"FlushMax90",(allocator<char> *)&local_7c8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_bc8,"Flush: 90%-Max time",(allocator<char> *)&local_940);
          psVar11 = &local_b28;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar11,"us",(allocator<char> *)&local_960);
          tcu::LogNumber<float>::LogNumber
                    (&local_610,&local_b88,&local_bc8,psVar11,QP_KEY_TAG_TIME,
                     stats.flush.max9DecileTime);
          tcu::LogNumber<float>::write(&local_610,iVar17,__buf_27,(size_t)psVar11);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_ba8,"FlushMedian",(allocator<char> *)&local_7e8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_be8,"Flush: Median time",(allocator<char> *)&local_980);
          psVar11 = &local_b48;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar11,"us",(allocator<char> *)&local_9a0);
          tcu::LogNumber<float>::LogNumber
                    (&local_380,&local_ba8,&local_be8,psVar11,QP_KEY_TAG_TIME,stats.flush.medianTime
                    );
          tcu::LogNumber<float>::write(&local_380,iVar17,__buf_28,(size_t)psVar11);
          tcu::LogNumber<float>::~LogNumber(&local_380);
          std::__cxx11::string::~string((string *)&local_b48);
          std::__cxx11::string::~string((string *)&local_be8);
          std::__cxx11::string::~string((string *)&local_ba8);
          tcu::LogNumber<float>::~LogNumber(&local_610);
          std::__cxx11::string::~string((string *)&local_b28);
          std::__cxx11::string::~string((string *)&local_bc8);
          std::__cxx11::string::~string((string *)&local_b88);
          tcu::LogNumber<float>::~LogNumber(&local_768);
          std::__cxx11::string::~string((string *)&local_b00);
          std::__cxx11::string::~string((string *)&local_b68);
          std::__cxx11::string::~string((string *)&contributionFitting);
          tcu::LogNumber<float>::~LogNumber(&local_860);
          std::__cxx11::string::~string((string *)&local_4d8);
          std::__cxx11::string::~string((string *)&local_6e0);
          std::__cxx11::string::~string((string *)&local_678);
          tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)local_aa8);
          std::__cxx11::string::~string((string *)&local_470);
          std::__cxx11::string::~string((string *)&local_540);
          std::__cxx11::string::~string((string *)&local_5a8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5a8,"AllocMin",(allocator<char> *)&local_ac8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_540,"Alloc: Min time",(allocator<char> *)&local_880);
          pLVar13 = &local_470;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)pLVar13,"us",(allocator<char> *)&local_8a0);
          tcu::LogNumber<float>::LogNumber
                    ((LogNumber<float> *)local_aa8,&local_5a8.m_name,&local_540.m_name,
                     &pLVar13->m_name,QP_KEY_TAG_TIME,stats.alloc.minTime);
          tcu::LogNumber<float>::write
                    ((LogNumber<float> *)local_aa8,iVar17,__buf_29,(size_t)pLVar13);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_678,"AllocMax",(allocator<char> *)&local_788);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6e0,"Alloc: Max time",(allocator<char> *)&local_8c0);
          pLVar13 = &local_4d8;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)pLVar13,"us",(allocator<char> *)&local_8e0);
          tcu::LogNumber<float>::LogNumber
                    (&local_860,&local_678.m_name,&local_6e0.m_name,&pLVar13->m_name,QP_KEY_TAG_TIME
                     ,stats.alloc.maxTime);
          tcu::LogNumber<float>::write(&local_860,iVar17,__buf_30,(size_t)pLVar13);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&contributionFitting,"AllocMin90",(allocator<char> *)&local_7a8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b68,"Alloc: 90%-Min time",(allocator<char> *)&local_900);
          psVar11 = &local_b00;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar11,"us",(allocator<char> *)&local_920);
          tcu::LogNumber<float>::LogNumber
                    (&local_768,(string *)&contributionFitting,&local_b68,psVar11,QP_KEY_TAG_TIME,
                     stats.alloc.min2DecileTime);
          tcu::LogNumber<float>::write(&local_768,iVar17,__buf_31,(size_t)psVar11);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b88,"AllocMax90",(allocator<char> *)&local_7c8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_bc8,"Alloc: 90%-Max time",(allocator<char> *)&local_940);
          psVar11 = &local_b28;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar11,"us",(allocator<char> *)&local_960);
          tcu::LogNumber<float>::LogNumber
                    (&local_610,&local_b88,&local_bc8,psVar11,QP_KEY_TAG_TIME,
                     stats.alloc.max9DecileTime);
          tcu::LogNumber<float>::write(&local_610,iVar17,__buf_32,(size_t)psVar11);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_ba8,"AllocMedian",(allocator<char> *)&local_7e8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_be8,"Alloc: Median time",(allocator<char> *)&local_980);
          psVar11 = &local_b48;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar11,"us",(allocator<char> *)&local_9a0);
          tcu::LogNumber<float>::LogNumber
                    (&local_380,&local_ba8,&local_be8,psVar11,QP_KEY_TAG_TIME,stats.alloc.medianTime
                    );
          tcu::LogNumber<float>::write(&local_380,iVar17,__buf_33,(size_t)psVar11);
          tcu::LogNumber<float>::~LogNumber(&local_380);
          std::__cxx11::string::~string((string *)&local_b48);
          std::__cxx11::string::~string((string *)&local_be8);
          std::__cxx11::string::~string((string *)&local_ba8);
          tcu::LogNumber<float>::~LogNumber(&local_610);
          std::__cxx11::string::~string((string *)&local_b28);
          std::__cxx11::string::~string((string *)&local_bc8);
          std::__cxx11::string::~string((string *)&local_b88);
          tcu::LogNumber<float>::~LogNumber(&local_768);
          std::__cxx11::string::~string((string *)&local_b00);
          std::__cxx11::string::~string((string *)&local_b68);
          std::__cxx11::string::~string((string *)&contributionFitting);
          tcu::LogNumber<float>::~LogNumber(&local_860);
          std::__cxx11::string::~string((string *)&local_4d8);
          std::__cxx11::string::~string((string *)&local_6e0);
          std::__cxx11::string::~string((string *)&local_678);
          tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)local_aa8);
          std::__cxx11::string::~string((string *)&local_470);
          std::__cxx11::string::~string((string *)&local_540);
          std::__cxx11::string::~string((string *)&local_5a8);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_b68,"Min",&local_bf9);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b00,"Total: Min time",&local_bfa);
          psVar11 = &local_b88;
          std::__cxx11::string::string<std::allocator<char>>((string *)psVar11,"us",&local_bfb);
          tcu::LogNumber<float>::LogNumber
                    ((LogNumber<float> *)local_aa8,&local_b68,&local_b00,psVar11,QP_KEY_TAG_TIME,
                     stats.result.minTime);
          tcu::LogNumber<float>::write
                    ((LogNumber<float> *)local_aa8,iVar17,__buf_34,(size_t)psVar11);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_bc8,"Max",&local_bfc);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b28,"Total: Max time",&local_bfd);
          psVar11 = &local_ba8;
          std::__cxx11::string::string<std::allocator<char>>((string *)psVar11,"us",&local_bfe);
          tcu::LogNumber<float>::LogNumber
                    (&local_860,&local_bc8,&local_b28,psVar11,QP_KEY_TAG_TIME,stats.result.maxTime);
          tcu::LogNumber<float>::write(&local_860,iVar17,__buf_35,(size_t)psVar11);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_be8,"Min90",&local_bff);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b48,"Total: 90%-Min time",&local_c00);
          psVar11 = &local_ac8;
          std::__cxx11::string::string<std::allocator<char>>((string *)psVar11,"us",&local_c01);
          tcu::LogNumber<float>::LogNumber
                    (&local_768,&local_be8,&local_b48,psVar11,QP_KEY_TAG_TIME,
                     stats.result.min2DecileTime);
          tcu::LogNumber<float>::write(&local_768,iVar17,__buf_36,(size_t)psVar11);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_880,"Max90",&local_c02);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_8a0,"Total: 90%-Max time",&local_c03);
          psVar11 = &local_788;
          std::__cxx11::string::string<std::allocator<char>>((string *)psVar11,"us",&local_c04);
          tcu::LogNumber<float>::LogNumber
                    (&local_610,&local_880,&local_8a0,psVar11,QP_KEY_TAG_TIME,
                     stats.result.max9DecileTime);
          tcu::LogNumber<float>::write(&local_610,iVar17,__buf_37,(size_t)psVar11);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_8c0,"Median",&local_c05);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_8e0,"Total: Median time",&local_c06);
          psVar11 = &local_7a8;
          std::__cxx11::string::string<std::allocator<char>>((string *)psVar11,"us",&local_c07);
          tcu::LogNumber<float>::LogNumber
                    (&local_380,&local_8c0,&local_8e0,psVar11,QP_KEY_TAG_TIME,
                     stats.result.medianTime);
          tcu::LogNumber<float>::write(&local_380,iVar17,__buf_38,(size_t)psVar11);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_900,"MedianTransfer",&local_c08);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_920,"Median transfer rate",&local_c09);
          psVar11 = &local_7c8;
          std::__cxx11::string::string<std::allocator<char>>((string *)psVar11,"MB / s",&local_c0a);
          tcu::LogNumber<float>::LogNumber
                    (&local_5a8,&local_900,&local_920,psVar11,QP_KEY_TAG_PERFORMANCE,
                     stats.medianRate * 0.0009765625 * 0.0009765625);
          tcu::LogNumber<float>::write(&local_5a8,iVar17,__buf_39,(size_t)psVar11);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_940,"MaxDiff",&local_be9);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_960,"Max difference to approximated",&local_bea);
          psVar11 = &local_7e8;
          std::__cxx11::string::string<std::allocator<char>>((string *)psVar11,"us",&local_beb);
          tcu::LogNumber<float>::LogNumber
                    (&local_540,&local_940,&local_960,psVar11,QP_KEY_TAG_TIME,stats.maxDiffTime);
          tcu::LogNumber<float>::write(&local_540,iVar17,__buf_40,(size_t)psVar11);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_980,"Max90Diff",&local_bec);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_9a0,"90%-Max difference to approximated",&local_bed);
          psVar11 = &local_2b8;
          std::__cxx11::string::string<std::allocator<char>>((string *)psVar11,"us",&local_bee);
          tcu::LogNumber<float>::LogNumber
                    (&local_470,&local_980,&local_9a0,psVar11,QP_KEY_TAG_TIME,
                     stats.maxDiff9DecileTime);
          tcu::LogNumber<float>::write(&local_470,iVar17,__buf_41,(size_t)psVar11);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2f8,"MedianDiff",&local_bef);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&section,"Median difference to approximated",&local_bf0);
          psVar11 = &local_198;
          std::__cxx11::string::string<std::allocator<char>>((string *)psVar11,"us",&local_bf1);
          tcu::LogNumber<float>::LogNumber
                    (&local_678,&local_2f8,(string *)&section,psVar11,QP_KEY_TAG_TIME,
                     stats.medianDiffTime);
          tcu::LogNumber<float>::write(&local_678,iVar17,__buf_42,(size_t)psVar11);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_218,"MaxRelDiff",&local_bf2);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_238,"Max relative difference to approximated",&local_bf3);
          psVar11 = &local_1b8;
          std::__cxx11::string::string<std::allocator<char>>((string *)psVar11,"%",&local_bf4);
          tcu::LogNumber<float>::LogNumber
                    (&local_6e0,&local_218,&local_238,psVar11,QP_KEY_TAG_NONE,
                     stats.maxRelDiffTime * 100.0);
          tcu::LogNumber<float>::write(&local_6e0,iVar17,__buf_43,(size_t)psVar11);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_258,"Max90RelDiff",&local_bf5);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_278,"90%-Max relative difference to approximated",&local_bf6);
          psVar11 = &local_1d8;
          std::__cxx11::string::string<std::allocator<char>>((string *)psVar11,"%",&local_bf7);
          tcu::LogNumber<float>::LogNumber
                    (&local_4d8,&local_258,&local_278,psVar11,QP_KEY_TAG_NONE,
                     stats.max9DecileRelDiffTime * 100.0);
          tcu::LogNumber<float>::write(&local_4d8,iVar17,__buf_44,(size_t)psVar11);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_298,"MedianRelDiff",&local_bf8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&section_3,"Median relative difference to approximated",&local_b01);
          psVar11 = &local_118;
          std::__cxx11::string::string<std::allocator<char>>((string *)psVar11,"%",&local_b02);
          tcu::LogNumber<float>::LogNumber
                    ((LogNumber<float> *)&contributionFitting,&local_298,(string *)&section_3,
                     psVar11,QP_KEY_TAG_NONE,stats.medianRelDiffTime * 100.0);
          tcu::LogNumber<float>::write
                    ((LogNumber<float> *)&contributionFitting,iVar17,__buf_45,(size_t)psVar11);
          tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&contributionFitting);
          std::__cxx11::string::~string((string *)&local_118);
          std::__cxx11::string::~string((string *)&section_3);
          std::__cxx11::string::~string((string *)&local_298);
          tcu::LogNumber<float>::~LogNumber(&local_4d8);
          std::__cxx11::string::~string((string *)&local_1d8);
          std::__cxx11::string::~string((string *)&local_278);
          std::__cxx11::string::~string((string *)&local_258);
          tcu::LogNumber<float>::~LogNumber(&local_6e0);
          std::__cxx11::string::~string((string *)&local_1b8);
          std::__cxx11::string::~string((string *)&local_238);
          std::__cxx11::string::~string((string *)&local_218);
          tcu::LogNumber<float>::~LogNumber(&local_678);
          std::__cxx11::string::~string((string *)&local_198);
          std::__cxx11::string::~string((string *)&section);
          std::__cxx11::string::~string((string *)&local_2f8);
          tcu::LogNumber<float>::~LogNumber(&local_470);
          std::__cxx11::string::~string((string *)&local_2b8);
          std::__cxx11::string::~string((string *)&local_9a0);
          std::__cxx11::string::~string((string *)&local_980);
          tcu::LogNumber<float>::~LogNumber(&local_540);
          std::__cxx11::string::~string((string *)&local_7e8);
          std::__cxx11::string::~string((string *)&local_960);
          std::__cxx11::string::~string((string *)&local_940);
          tcu::LogNumber<float>::~LogNumber(&local_5a8);
          std::__cxx11::string::~string((string *)&local_7c8);
          std::__cxx11::string::~string((string *)&local_920);
          std::__cxx11::string::~string((string *)&local_900);
          tcu::LogNumber<float>::~LogNumber(&local_380);
          std::__cxx11::string::~string((string *)&local_7a8);
          std::__cxx11::string::~string((string *)&local_8e0);
          std::__cxx11::string::~string((string *)&local_8c0);
          tcu::LogNumber<float>::~LogNumber(&local_610);
          std::__cxx11::string::~string((string *)&local_788);
          std::__cxx11::string::~string((string *)&local_8a0);
          std::__cxx11::string::~string((string *)&local_880);
          tcu::LogNumber<float>::~LogNumber(&local_768);
          std::__cxx11::string::~string((string *)&local_ac8);
          std::__cxx11::string::~string((string *)&local_b48);
          std::__cxx11::string::~string((string *)&local_be8);
          tcu::LogNumber<float>::~LogNumber(&local_860);
          std::__cxx11::string::~string((string *)&local_ba8);
          std::__cxx11::string::~string((string *)&local_b28);
          std::__cxx11::string::~string((string *)&local_bc8);
          tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)local_aa8);
          std::__cxx11::string::~string((string *)&local_b88);
          std::__cxx11::string::~string((string *)&local_b00);
          std::__cxx11::string::~string((string *)&local_b68);
          tcu::ScopedLogSection::~ScopedLogSection(&section_1);
        }
      }
      lVar16 = 0x48;
      do {
        std::
        vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
        ::~vector((vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                   *)((long)&buckets[0].
                             super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar16));
        lVar16 = lVar16 + -0x18;
      } while (lVar16 != -0x18);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stats,"Contribution",(allocator<char> *)&local_860);
      uVar2 = local_ad8._0_8_;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_aa8,"Contributions",(allocator<char> *)&local_768);
      psVar11 = (string *)local_aa8;
      tcu::ScopedLogSection::ScopedLogSection
                ((ScopedLogSection *)buckets,pTVar4,(string *)&stats,psVar11);
      std::__cxx11::string::~string((string *)local_aa8);
      std::__cxx11::string::~string((string *)&stats);
      (anonymous_namespace)::
      fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>>
                (&contributionFitting,(_anonymous_namespace_ *)uVar2,
                 (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                  *)0x0,(offset_in_SampleType_to_deUint64)psVar11);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_768,"MapConstantCost",(allocator<char> *)&local_b68);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_610,"Map: Approximated contant cost",(allocator<char> *)&local_b00
                );
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_380,"us",(allocator<char> *)&local_b88);
      pLVar13 = &local_380;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&stats,&local_768.m_name,&local_610.m_name,&pLVar13->m_name,
                 QP_KEY_TAG_TIME,contributionFitting.offset);
      tcu::LogNumber<float>::write((LogNumber<float> *)&stats,iVar17,__buf_46,(size_t)pLVar13);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5a8,"MapLinearCost",(allocator<char> *)&local_bc8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_540,"Map: Approximated linear cost",(allocator<char> *)&local_b28)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_470,"us / MB",(allocator<char> *)&local_ba8);
      pLVar13 = &local_470;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_aa8,&local_5a8.m_name,&local_540.m_name,&pLVar13->m_name,
                 QP_KEY_TAG_TIME,contributionFitting.coefficient * 1024.0 * 1024.0);
      tcu::LogNumber<float>::write((LogNumber<float> *)local_aa8,iVar17,__buf_47,(size_t)pLVar13);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_678,"MapMedianCost",(allocator<char> *)&local_be8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6e0,"Map: Median cost",(allocator<char> *)&local_b48);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4d8,"us",(allocator<char> *)&local_ac8);
      pLVar13 = &local_4d8;
      tcu::LogNumber<float>::LogNumber
                (&local_860,&local_678.m_name,&local_6e0.m_name,&pLVar13->m_name,QP_KEY_TAG_TIME,
                 resultStats.map.medianTime);
      tcu::LogNumber<float>::write(&local_860,iVar17,__buf_48,(size_t)pLVar13);
      tcu::LogNumber<float>::~LogNumber(&local_860);
      std::__cxx11::string::~string((string *)&local_4d8);
      std::__cxx11::string::~string((string *)&local_6e0);
      std::__cxx11::string::~string((string *)&local_678);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)local_aa8);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::string::~string((string *)&local_540);
      std::__cxx11::string::~string((string *)&local_5a8);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&stats);
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)&local_610);
      std::__cxx11::string::~string((string *)&local_768);
      (anonymous_namespace)::
      fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>>
                (&contributionFitting,(_anonymous_namespace_ *)uVar2,
                 (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                  *)0x8,(offset_in_SampleType_to_deUint64)pLVar13);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_768,"UnmapConstantCost",(allocator<char> *)&local_b68);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_610,"Unmap: Approximated contant cost",
                 (allocator<char> *)&local_b00);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_380,"us",(allocator<char> *)&local_b88);
      pLVar13 = &local_380;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&stats,&local_768.m_name,&local_610.m_name,&pLVar13->m_name,
                 QP_KEY_TAG_TIME,contributionFitting.offset);
      tcu::LogNumber<float>::write((LogNumber<float> *)&stats,iVar17,__buf_49,(size_t)pLVar13);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5a8,"UnmapLinearCost",(allocator<char> *)&local_bc8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_540,"Unmap: Approximated linear cost",
                 (allocator<char> *)&local_b28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_470,"us / MB",(allocator<char> *)&local_ba8);
      pLVar13 = &local_470;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_aa8,&local_5a8.m_name,&local_540.m_name,&pLVar13->m_name,
                 QP_KEY_TAG_TIME,contributionFitting.coefficient * 1024.0 * 1024.0);
      tcu::LogNumber<float>::write((LogNumber<float> *)local_aa8,iVar17,__buf_50,(size_t)pLVar13);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_678,"UnmapMedianCost",(allocator<char> *)&local_be8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6e0,"Unmap: Median cost",(allocator<char> *)&local_b48);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4d8,"us",(allocator<char> *)&local_ac8);
      pLVar13 = &local_4d8;
      tcu::LogNumber<float>::LogNumber
                (&local_860,&local_678.m_name,&local_6e0.m_name,&pLVar13->m_name,QP_KEY_TAG_TIME,
                 resultStats.unmap.medianTime);
      tcu::LogNumber<float>::write(&local_860,iVar17,__buf_51,(size_t)pLVar13);
      tcu::LogNumber<float>::~LogNumber(&local_860);
      std::__cxx11::string::~string((string *)&local_4d8);
      std::__cxx11::string::~string((string *)&local_6e0);
      std::__cxx11::string::~string((string *)&local_678);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)local_aa8);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::string::~string((string *)&local_540);
      std::__cxx11::string::~string((string *)&local_5a8);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&stats);
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)&local_610);
      std::__cxx11::string::~string((string *)&local_768);
      (anonymous_namespace)::
      fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>>
                (&contributionFitting,(_anonymous_namespace_ *)uVar2,
                 (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                  *)0x10,(offset_in_SampleType_to_deUint64)pLVar13);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_768,"WriteConstantCost",(allocator<char> *)&local_b68);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_610,"Write: Approximated contant cost",
                 (allocator<char> *)&local_b00);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_380,"us",(allocator<char> *)&local_b88);
      pLVar13 = &local_380;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&stats,&local_768.m_name,&local_610.m_name,&pLVar13->m_name,
                 QP_KEY_TAG_TIME,contributionFitting.offset);
      tcu::LogNumber<float>::write((LogNumber<float> *)&stats,iVar17,__buf_52,(size_t)pLVar13);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5a8,"WriteLinearCost",(allocator<char> *)&local_bc8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_540,"Write: Approximated linear cost",
                 (allocator<char> *)&local_b28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_470,"us / MB",(allocator<char> *)&local_ba8);
      pLVar13 = &local_470;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_aa8,&local_5a8.m_name,&local_540.m_name,&pLVar13->m_name,
                 QP_KEY_TAG_TIME,contributionFitting.coefficient * 1024.0 * 1024.0);
      tcu::LogNumber<float>::write((LogNumber<float> *)local_aa8,iVar17,__buf_53,(size_t)pLVar13);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_678,"WriteMedianCost",(allocator<char> *)&local_be8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6e0,"Write: Median cost",(allocator<char> *)&local_b48);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4d8,"us",(allocator<char> *)&local_ac8);
      pLVar13 = &local_4d8;
      tcu::LogNumber<float>::LogNumber
                (&local_860,&local_678.m_name,&local_6e0.m_name,&pLVar13->m_name,QP_KEY_TAG_TIME,
                 resultStats.write.medianTime);
      tcu::LogNumber<float>::write(&local_860,iVar17,__buf_54,(size_t)pLVar13);
      tcu::LogNumber<float>::~LogNumber(&local_860);
      std::__cxx11::string::~string((string *)&local_4d8);
      std::__cxx11::string::~string((string *)&local_6e0);
      std::__cxx11::string::~string((string *)&local_678);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)local_aa8);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::string::~string((string *)&local_540);
      std::__cxx11::string::~string((string *)&local_5a8);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&stats);
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)&local_610);
      std::__cxx11::string::~string((string *)&local_768);
      (anonymous_namespace)::
      fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>>
                (&contributionFitting,(_anonymous_namespace_ *)uVar2,
                 (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                  *)0x18,(offset_in_SampleType_to_deUint64)pLVar13);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_768,"FlushConstantCost",(allocator<char> *)&local_b68);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_610,"Flush: Approximated contant cost",
                 (allocator<char> *)&local_b00);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_380,"us",(allocator<char> *)&local_b88);
      pLVar13 = &local_380;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&stats,&local_768.m_name,&local_610.m_name,&pLVar13->m_name,
                 QP_KEY_TAG_TIME,contributionFitting.offset);
      tcu::LogNumber<float>::write((LogNumber<float> *)&stats,iVar17,__buf_55,(size_t)pLVar13);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5a8,"FlushLinearCost",(allocator<char> *)&local_bc8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_540,"Flush: Approximated linear cost",
                 (allocator<char> *)&local_b28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_470,"us / MB",(allocator<char> *)&local_ba8);
      pLVar13 = &local_470;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_aa8,&local_5a8.m_name,&local_540.m_name,&pLVar13->m_name,
                 QP_KEY_TAG_TIME,contributionFitting.coefficient * 1024.0 * 1024.0);
      tcu::LogNumber<float>::write((LogNumber<float> *)local_aa8,iVar17,__buf_56,(size_t)pLVar13);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_678,"FlushMedianCost",(allocator<char> *)&local_be8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6e0,"Flush: Median cost",(allocator<char> *)&local_b48);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4d8,"us",(allocator<char> *)&local_ac8);
      pLVar13 = &local_4d8;
      tcu::LogNumber<float>::LogNumber
                (&local_860,&local_678.m_name,&local_6e0.m_name,&pLVar13->m_name,QP_KEY_TAG_TIME,
                 resultStats.flush.medianTime);
      tcu::LogNumber<float>::write(&local_860,iVar17,__buf_57,(size_t)pLVar13);
      tcu::LogNumber<float>::~LogNumber(&local_860);
      std::__cxx11::string::~string((string *)&local_4d8);
      std::__cxx11::string::~string((string *)&local_6e0);
      std::__cxx11::string::~string((string *)&local_678);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)local_aa8);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::string::~string((string *)&local_540);
      std::__cxx11::string::~string((string *)&local_5a8);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&stats);
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)&local_610);
      std::__cxx11::string::~string((string *)&local_768);
      (anonymous_namespace)::
      fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>>
                (&contributionFitting,(_anonymous_namespace_ *)uVar2,
                 (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                  *)0x20,(offset_in_SampleType_to_deUint64)pLVar13);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_768,"AllocConstantCost",(allocator<char> *)&local_b68);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_610,"Alloc: Approximated contant cost",
                 (allocator<char> *)&local_b00);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_380,"us",(allocator<char> *)&local_b88);
      pLVar13 = &local_380;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&stats,&local_768.m_name,&local_610.m_name,&pLVar13->m_name,
                 QP_KEY_TAG_TIME,contributionFitting.offset);
      tcu::LogNumber<float>::write((LogNumber<float> *)&stats,iVar17,__buf_58,(size_t)pLVar13);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5a8,"AllocLinearCost",(allocator<char> *)&local_bc8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_540,"Alloc: Approximated linear cost",
                 (allocator<char> *)&local_b28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_470,"us / MB",(allocator<char> *)&local_ba8);
      pLVar13 = &local_470;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_aa8,&local_5a8.m_name,&local_540.m_name,&pLVar13->m_name,
                 QP_KEY_TAG_TIME,contributionFitting.coefficient * 1024.0 * 1024.0);
      tcu::LogNumber<float>::write((LogNumber<float> *)local_aa8,iVar17,__buf_59,(size_t)pLVar13);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_678,"AllocMedianCost",(allocator<char> *)&local_be8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6e0,"Alloc: Median cost",(allocator<char> *)&local_b48);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4d8,"us",(allocator<char> *)&local_ac8);
      pLVar13 = &local_4d8;
      tcu::LogNumber<float>::LogNumber
                (&local_860,&local_678.m_name,&local_6e0.m_name,&pLVar13->m_name,QP_KEY_TAG_TIME,
                 resultStats.alloc.medianTime);
      tcu::LogNumber<float>::write(&local_860,iVar17,__buf_60,(size_t)pLVar13);
      tcu::LogNumber<float>::~LogNumber(&local_860);
      std::__cxx11::string::~string((string *)&local_4d8);
      std::__cxx11::string::~string((string *)&local_6e0);
      std::__cxx11::string::~string((string *)&local_678);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)local_aa8);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::string::~string((string *)&local_540);
      std::__cxx11::string::~string((string *)&local_5a8);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&stats);
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)&local_610);
      std::__cxx11::string::~string((string *)&local_768);
      tcu::ScopedLogSection::~ScopedLogSection((ScopedLogSection *)buckets);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stats,"Results",(allocator<char> *)&local_860);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_aa8,"Results",(allocator<char> *)&local_768);
      tcu::ScopedLogSection::ScopedLogSection
                (&section_3,pTVar4,(string *)&stats,(string *)local_aa8);
      std::__cxx11::string::~string((string *)local_aa8);
      std::__cxx11::string::~string((string *)&stats);
      fVar27 = (float)((*(int *)(*(long *)(uVar2 + 8) + -0x48) + **(int **)uVar2) / 2);
      local_700 = theilSenFitting.coefficient * fVar27;
      local_6fc = theilSenFitting.offset + local_700;
      uVar12 = (*(long *)(uVar2 + 8) - (long)*(int **)uVar2) / 0x48;
      uVar12 = (long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 | uVar12 & 0xffffffff) / 2;
      (anonymous_namespace)::
      fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>>
                ((LineParametersWithConfidence *)&stats,(_anonymous_namespace_ *)uVar2,
                 (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                  *)0x0,(int)uVar12,0x30,in_R9);
      (anonymous_namespace)::
      fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>>
                ((LineParametersWithConfidence *)local_aa8,(_anonymous_namespace_ *)uVar2,
                 (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                  *)(uVar12 & 0xffffffff),(int)((*(long *)(uVar2 + 8) - *(long *)uVar2) / 0x48),0x30
                 ,in_R9);
      lVar16 = *(long *)uVar2;
      lVar21 = *(long *)(uVar2 + 8);
      fVar25 = (float)*(int *)(lVar16 + 8);
      fVar26 = (float)*(int *)(lVar21 + -0x40);
      local_ae0 = CONCAT44(local_ae0._4_4_,fVar25);
      local_7f0 = CONCAT44(local_7f0._4_4_,fVar26);
      local_6e8 = stats.map.minTime;
      local_318 = ZEXT416((uint)stats.map.min2DecileTime);
      local_6e4 = (float)local_aa8._0_4_;
      local_d8 = ZEXT416((uint)local_aa8._12_4_);
      fVar25 = getAreaBetweenLines(fVar25,fVar26,stats.map.minTime,stats.map.min2DecileTime,
                                   (float)local_aa8._0_4_,(float)local_aa8._12_4_);
      local_7f8 = (pointer)CONCAT44(local_7f8._4_4_,fVar25);
      uVar2 = local_ad8._0_8_;
      fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
                ((LineParametersWithConfidence *)&stats,
                 (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                  *)local_ad8._0_8_,0,(int)((lVar21 - lVar16) / 0x48),2,0x30);
      fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
                ((LineParametersWithConfidence *)local_aa8,
                 (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                  *)uVar2,1,
                 (int)(((long)(((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                                 *)uVar2)->_M_impl).super__Vector_impl_data._M_finish -
                       (long)(((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                                *)uVar2)->_M_impl).super__Vector_impl_data._M_start) / 0x48),2,0x30)
      ;
      fVar25 = (float)((((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                          *)uVar2)->_M_impl).super__Vector_impl_data._M_start)->writtenSize;
      local_6ec = (float)(((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                            *)uVar2)->_M_impl).super__Vector_impl_data._M_finish[-1].writtenSize;
      local_ad8._0_4_ = fVar25;
      local_6f8 = stats.map.minTime;
      local_e8 = ZEXT416((uint)stats.map.min2DecileTime);
      local_6f4 = (float)local_aa8._0_4_;
      local_f8 = ZEXT416((uint)local_aa8._12_4_);
      local_6f0 = getAreaBetweenLines(fVar25,local_6ec,stats.map.minTime,stats.map.min2DecileTime,
                                      (float)local_aa8._0_4_,(float)local_aa8._12_4_);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&contributionFitting,"ResultLinearity",(allocator<char> *)&local_118);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)buckets,"Sample linearity",(allocator<char> *)&section_1);
      pTVar4 = local_300;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b68,"%",&local_bf9);
      fVar25 = (float)local_318._0_4_ * (float)local_ae0 + local_6e8;
      fVar26 = (float)local_d8._0_4_ * (float)local_ae0 + local_6e4;
      uVar5 = -(uint)(fVar25 <= fVar26);
      fVar28 = (float)local_318._0_4_ * (float)local_7f0 + local_6e8;
      fVar29 = (float)local_d8._0_4_ * (float)local_7f0 + local_6e4;
      uVar24 = -(uint)(fVar29 <= fVar28);
      fVar25 = ((float)(~uVar24 & (uint)fVar29 | (uint)fVar28 & uVar24) -
               (float)(~uVar5 & (uint)fVar26 | (uint)fVar25 & uVar5)) *
               ((float)local_7f0 - (float)local_ae0);
      fVar26 = (float)(~-(uint)(fVar25 < 1e-06) & (uint)(1.0 - local_7f8._0_4_ / fVar25));
      fVar25 = 1.0;
      if (fVar26 <= 1.0) {
        fVar25 = fVar26;
      }
      psVar11 = &local_b68;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&stats,(string *)&contributionFitting,(string *)buckets,psVar11
                 ,QP_KEY_TAG_QUALITY,(float)(~-(uint)(fVar26 < 0.0) & (uint)(fVar25 * 100.0)));
      iVar17 = (int)pTVar4;
      tcu::LogNumber<float>::write((LogNumber<float> *)&stats,iVar17,__buf_61,(size_t)psVar11);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b00,"SampleTemporalStability",&local_bfa);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b88,"Sample temporal stability",&local_bfb);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_bc8,"%",&local_bfc);
      fVar25 = (float)local_e8._0_4_ * (float)local_ad8._0_4_ + local_6f8;
      fVar26 = (float)local_f8._0_4_ * (float)local_ad8._0_4_ + local_6f4;
      uVar5 = -(uint)(fVar25 <= fVar26);
      fVar28 = (float)local_e8._0_4_ * local_6ec + local_6f8;
      fVar29 = (float)local_f8._0_4_ * local_6ec + local_6f4;
      uVar24 = -(uint)(fVar29 <= fVar28);
      fVar25 = ((float)(~uVar24 & (uint)fVar29 | (uint)fVar28 & uVar24) -
               (float)(~uVar5 & (uint)fVar26 | (uint)fVar25 & uVar5)) *
               (local_6ec - (float)local_ad8._0_4_);
      fVar26 = (float)(~-(uint)(fVar25 < 1e-06) & (uint)(1.0 - local_6f0 / fVar25));
      fVar25 = 1.0;
      if (fVar26 <= 1.0) {
        fVar25 = fVar26;
      }
      psVar11 = &local_bc8;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_aa8,&local_b00,&local_b88,psVar11,QP_KEY_TAG_QUALITY,
                 (float)(~-(uint)(fVar26 < 0.0) & (uint)(fVar25 * 100.0)));
      tcu::LogNumber<float>::write((LogNumber<float> *)local_aa8,iVar17,__buf_62,(size_t)psVar11);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b28,"ApproximatedConstantCost",&local_bfd);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ba8,"Approximated contant cost",&local_bfe);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_be8,"us",&local_bff);
      psVar11 = &local_be8;
      tcu::LogNumber<float>::LogNumber
                (&local_860,&local_b28,&local_ba8,psVar11,QP_KEY_TAG_TIME,theilSenFitting.offset);
      tcu::LogNumber<float>::write(&local_860,iVar17,__buf_63,(size_t)psVar11);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b48,"ApproximatedConstantCostConfidence60Lower",&local_c00);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ac8,"Approximated contant cost 60% confidence lower limit",
                 &local_c01);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_880,"us",&local_c02);
      psVar11 = &local_880;
      tcu::LogNumber<float>::LogNumber
                (&local_768,&local_b48,&local_ac8,psVar11,QP_KEY_TAG_TIME,
                 theilSenFitting.offsetConfidenceLower);
      tcu::LogNumber<float>::write(&local_768,iVar17,__buf_64,(size_t)psVar11);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8a0,"ApproximatedConstantCostConfidence60Upper",&local_c03);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_788,"Approximated contant cost 60% confidence upper limit",
                 &local_c04);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c0,"us",&local_c05);
      psVar11 = &local_8c0;
      tcu::LogNumber<float>::LogNumber
                (&local_610,&local_8a0,&local_788,psVar11,QP_KEY_TAG_TIME,
                 theilSenFitting.offsetConfidenceUpper);
      tcu::LogNumber<float>::write(&local_610,iVar17,__buf_65,(size_t)psVar11);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8e0,"ApproximatedLinearCost",&local_c06);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7a8,"Approximated linear cost",&local_c07);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_900,"us / MB",&local_c08);
      psVar11 = &local_900;
      tcu::LogNumber<float>::LogNumber
                (&local_380,&local_8e0,&local_7a8,psVar11,QP_KEY_TAG_TIME,
                 theilSenFitting.coefficient * 1024.0 * 1024.0);
      tcu::LogNumber<float>::write(&local_380,iVar17,__buf_66,(size_t)psVar11);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_920,"ApproximatedLinearCostConfidence60Lower",&local_c09);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7c8,"Approximated linear cost 60% confidence lower limit",
                 &local_c0a);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_940,"us / MB",&local_be9);
      psVar11 = &local_940;
      tcu::LogNumber<float>::LogNumber
                (&local_5a8,&local_920,&local_7c8,psVar11,QP_KEY_TAG_TIME,
                 theilSenFitting.coefficientConfidenceLower * 1024.0 * 1024.0);
      tcu::LogNumber<float>::write(&local_5a8,iVar17,__buf_67,(size_t)psVar11);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_960,"ApproximatedLinearCostConfidence60Upper",&local_bea);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7e8,"Approximated linear cost 60% confidence upper limit",
                 &local_beb);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_980,"us / MB",&local_bec);
      psVar11 = &local_980;
      tcu::LogNumber<float>::LogNumber
                (&local_540,&local_960,&local_7e8,psVar11,QP_KEY_TAG_TIME,
                 theilSenFitting.coefficientConfidenceUpper * 1024.0 * 1024.0);
      tcu::LogNumber<float>::write(&local_540,iVar17,__buf_68,(size_t)psVar11);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_9a0,"ApproximatedTransferRate",&local_bed);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b8,"Approximated transfer rate",&local_bee);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"MB / s",&local_bef);
      fVar25 = fVar27 / ((local_6fc / 1000.0) / 1000.0);
      local_ad8 = ZEXT416((uint)fVar25);
      psVar11 = &local_2f8;
      tcu::LogNumber<float>::LogNumber
                (&local_470,&local_9a0,&local_2b8,psVar11,QP_KEY_TAG_PERFORMANCE,
                 fVar25 * 0.0009765625 * 0.0009765625);
      tcu::LogNumber<float>::write(&local_470,iVar17,__buf_69,(size_t)psVar11);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&section,"ApproximatedTransferRateNoConstant",&local_bf0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_198,"Approximated transfer rate without constant cost",&local_bf1)
      ;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"MB / s",&local_bf2);
      fVar27 = fVar27 / ((local_700 / 1000.0) / 1000.0);
      psVar11 = &local_218;
      tcu::LogNumber<float>::LogNumber
                (&local_678,(string *)&section,&local_198,psVar11,QP_KEY_TAG_PERFORMANCE,
                 fVar27 * 0.0009765625 * 0.0009765625);
      tcu::LogNumber<float>::write(&local_678,iVar17,__buf_70,(size_t)psVar11);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,"SampleMedianTime",&local_bf3);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b8,"Median sample time",&local_bf4);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"us",&local_bf5);
      psVar11 = &local_258;
      tcu::LogNumber<float>::LogNumber
                (&local_6e0,&local_238,&local_1b8,psVar11,QP_KEY_TAG_TIME,
                 resultStats.result.medianTime);
      tcu::LogNumber<float>::write(&local_6e0,iVar17,__buf_71,(size_t)psVar11);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_278,"SampleMedianTransfer",&local_bf6);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,"Median transfer rate",&local_bf7);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"MB / s",&local_bf8);
      psVar11 = &local_298;
      tcu::LogNumber<float>::LogNumber
                (&local_4d8,&local_278,&local_1d8,psVar11,QP_KEY_TAG_PERFORMANCE,
                 resultStats.medianRate * 0.0009765625 * 0.0009765625);
      tcu::LogNumber<float>::write(&local_4d8,iVar17,__buf_72,(size_t)psVar11);
      tcu::LogNumber<float>::~LogNumber(&local_4d8);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_278);
      tcu::LogNumber<float>::~LogNumber(&local_6e0);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_238);
      tcu::LogNumber<float>::~LogNumber(&local_678);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&section);
      tcu::LogNumber<float>::~LogNumber(&local_470);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_9a0);
      tcu::LogNumber<float>::~LogNumber(&local_540);
      std::__cxx11::string::~string((string *)&local_980);
      std::__cxx11::string::~string((string *)&local_7e8);
      std::__cxx11::string::~string((string *)&local_960);
      tcu::LogNumber<float>::~LogNumber(&local_5a8);
      std::__cxx11::string::~string((string *)&local_940);
      std::__cxx11::string::~string((string *)&local_7c8);
      std::__cxx11::string::~string((string *)&local_920);
      tcu::LogNumber<float>::~LogNumber(&local_380);
      std::__cxx11::string::~string((string *)&local_900);
      std::__cxx11::string::~string((string *)&local_7a8);
      std::__cxx11::string::~string((string *)&local_8e0);
      tcu::LogNumber<float>::~LogNumber(&local_610);
      std::__cxx11::string::~string((string *)&local_8c0);
      std::__cxx11::string::~string((string *)&local_788);
      std::__cxx11::string::~string((string *)&local_8a0);
      tcu::LogNumber<float>::~LogNumber(&local_768);
      std::__cxx11::string::~string((string *)&local_880);
      std::__cxx11::string::~string((string *)&local_ac8);
      std::__cxx11::string::~string((string *)&local_b48);
      tcu::LogNumber<float>::~LogNumber(&local_860);
      std::__cxx11::string::~string((string *)&local_be8);
      std::__cxx11::string::~string((string *)&local_ba8);
      std::__cxx11::string::~string((string *)&local_b28);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)local_aa8);
      std::__cxx11::string::~string((string *)&local_bc8);
      std::__cxx11::string::~string((string *)&local_b88);
      std::__cxx11::string::~string((string *)&local_b00);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&stats);
      std::__cxx11::string::~string((string *)&local_b68);
      std::__cxx11::string::~string((string *)buckets);
      std::__cxx11::string::~string((string *)&contributionFitting);
      tcu::ScopedLogSection::~ScopedLogSection(&section_3);
      UVar30.transferRateAtRange = (float)local_ad8._0_4_;
      UVar30.transferRateMedian = resultStats.medianRate;
      UVar30.transferRateAtInfinity = fVar27;
      return UVar30;
    }
    local_ae0 = lVar14;
    local_7f0 = lVar7;
    fVar26 = floorf(((float)(int)(*(int *)(lVar16 + 4 + lVar14) - uVar15) / fVar25) * 4.0);
    uVar5 = (uint)fVar26;
    if (2 < (int)uVar5) {
      uVar5 = 3;
    }
    uVar12 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar12 = 0;
    }
    pUVar10 = buckets[uVar12].
              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pUVar10 ==
        buckets[uVar12].
        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      this = buckets[uVar12].
             super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      __n = (long)pUVar10 - (long)this;
      if (__n == 0x7ffffffffffffff8) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar8 = (long)__n / 0x48;
      uVar9 = uVar8;
      if (pUVar10 == this) {
        uVar9 = 1;
      }
      uVar20 = uVar9 + uVar8;
      if (0x1c71c71c71c71c6 < uVar20) {
        uVar20 = 0x1c71c71c71c71c7;
      }
      if (CARRY8(uVar9,uVar8)) {
        uVar20 = 0x1c71c71c71c71c7;
      }
      if (uVar20 == 0) {
        pUVar10 = (pointer)0x0;
      }
      else {
        local_7f8 = this;
        pUVar10 = (pointer)operator_new(uVar20 * 0x48);
        this = local_7f8;
      }
      puVar18 = (undefined8 *)(lVar16 + lVar14);
      pUVar19 = pUVar10 + uVar8;
      for (lVar21 = 9; lVar21 != 0; lVar21 = lVar21 + -1) {
        uVar2 = *puVar18;
        pUVar19->bufferSize = (int)uVar2;
        pUVar19->allocatedSize = (int)((ulong)uVar2 >> 0x20);
        puVar18 = puVar18 + (ulong)bVar23 * -2 + 1;
        pUVar19 = (pointer)((long)pUVar19 + ((ulong)bVar23 * -2 + 1) * 8);
      }
      if (0 < (long)__n) {
        memmove(pUVar10,this,__n);
      }
      lVar16 = (long)buckets[uVar12].
                     super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)this;
      std::
      _Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
      ::_M_deallocate((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                       *)this,(pointer)(lVar16 / 0x48),lVar16 % 0x48);
      buckets[uVar12].
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pUVar10;
      buckets[uVar12].
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)(__n + 0x48 + (long)pUVar10);
      buckets[uVar12].
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pUVar10 + uVar20;
      plVar22 = (long *)local_ad8._0_8_;
      uVar15 = local_318._0_4_;
    }
    else {
      puVar18 = (undefined8 *)(lVar16 + lVar14);
      for (lVar21 = 9; lVar21 != 0; lVar21 = lVar21 + -1) {
        uVar2 = *puVar18;
        pUVar10->bufferSize = (int)uVar2;
        pUVar10->allocatedSize = (int)((ulong)uVar2 >> 0x20);
        puVar18 = puVar18 + (ulong)bVar23 * -2 + 1;
        pUVar10 = (pointer)((long)pUVar10 + (ulong)bVar23 * -0x10 + 8);
      }
      ppUVar1 = &buckets[uVar12].
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppUVar1 = *ppUVar1 + 1;
    }
    lVar7 = local_7f0 + 1;
    lVar16 = *plVar22;
    lVar21 = plVar22[1];
    lVar14 = local_ae0 + 0x48;
  } while( true );
}

Assistant:

static UploadSampleAnalyzeResult analyzeSampleResults (tcu::TestLog& log, const std::vector<UploadSampleResult<SampleType> >& samples, bool logBucketPerformance)
{
	// Assume data is linear with some outliers, fit a line
	const LineParametersWithConfidence						theilSenFitting						= fitLineToSamples(samples);
	const typename SampleTypeTraits<SampleType>::StatsType	resultStats							= calculateSampleStatistics(theilSenFitting, samples);
	float													approximatedTransferRate;
	float													approximatedTransferRateNoConstant;

	// Output raw samples
	{
		const tcu::ScopedLogSection	section(log, "Samples", "Samples");
		logSampleList(log, theilSenFitting, samples);
	}

	// Calculate results for different ranges
	if (logBucketPerformance)
	{
		const int										numBuckets				= 4;
		int												minBufferSize			= 0;
		int												maxBufferSize			= 0;
		std::vector<UploadSampleResult<SampleType> >	buckets[numBuckets];

		bucketizeSamplesUniformly(samples, &buckets[0], numBuckets, minBufferSize, maxBufferSize);

		for (int bucketNdx = 0; bucketNdx < numBuckets; ++bucketNdx)
		{
			if (buckets[bucketNdx].empty())
				continue;

			// Print a nice result summary

			const int												bucketRangeMin	= minBufferSize + (int)(((float) bucketNdx    / (float)numBuckets) * (float)(maxBufferSize - minBufferSize));
			const int												bucketRangeMax	= minBufferSize + (int)(((float)(bucketNdx+1) / (float)numBuckets) * (float)(maxBufferSize - minBufferSize));
			const typename SampleTypeTraits<SampleType>::StatsType	stats			= calculateSampleStatistics(theilSenFitting, buckets[bucketNdx]);
			const tcu::ScopedLogSection								section			(log, "BufferSizeRange", std::string("Transfer performance with buffer size in range [").append(getHumanReadableByteSize(bucketRangeMin).append(", ").append(getHumanReadableByteSize(bucketRangeMax).append("]"))));

			logMapRangeStats<SampleType>(log, stats);
			logUnmapStats<SampleType>(log, stats);
			logWriteStats<SampleType>(log, stats);
			logFlushStats<SampleType>(log, stats);
			logAllocStats<SampleType>(log, stats);

			log	<< tcu::TestLog::Float("Min", "Total: Min time", "us", QP_KEY_TAG_TIME, stats.result.minTime)
				<< tcu::TestLog::Float("Max", "Total: Max time", "us", QP_KEY_TAG_TIME, stats.result.maxTime)
				<< tcu::TestLog::Float("Min90", "Total: 90%-Min time", "us", QP_KEY_TAG_TIME, stats.result.min2DecileTime)
				<< tcu::TestLog::Float("Max90", "Total: 90%-Max time", "us", QP_KEY_TAG_TIME, stats.result.max9DecileTime)
				<< tcu::TestLog::Float("Median", "Total: Median time", "us", QP_KEY_TAG_TIME, stats.result.medianTime)
				<< tcu::TestLog::Float("MedianTransfer", "Median transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, stats.medianRate / 1024.0f / 1024.0f)
				<< tcu::TestLog::Float("MaxDiff", "Max difference to approximated", "us", QP_KEY_TAG_TIME, stats.maxDiffTime)
				<< tcu::TestLog::Float("Max90Diff", "90%-Max difference to approximated", "us", QP_KEY_TAG_TIME, stats.maxDiff9DecileTime)
				<< tcu::TestLog::Float("MedianDiff", "Median difference to approximated", "us", QP_KEY_TAG_TIME, stats.medianDiffTime)
				<< tcu::TestLog::Float("MaxRelDiff", "Max relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.maxRelDiffTime * 100.0f)
				<< tcu::TestLog::Float("Max90RelDiff", "90%-Max relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.max9DecileRelDiffTime * 100.0f)
				<< tcu::TestLog::Float("MedianRelDiff", "Median relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.medianRelDiffTime * 100.0f);
		}
	}

	// Contributions
	if (SampleTypeTraits<SampleType>::LOG_CONTRIBUTIONS)
	{
		const tcu::ScopedLogSection	section(log, "Contribution", "Contributions");

		logMapContribution(log, samples, resultStats);
		logUnmapContribution(log, samples, resultStats);
		logWriteContribution(log, samples, resultStats);
		logFlushContribution(log, samples, resultStats);
		logAllocContribution(log, samples, resultStats);
	}

	// Print results
	{
		const tcu::ScopedLogSection	section(log, "Results", "Results");

		const int	medianBufferSize					= (samples.front().bufferSize + samples.back().bufferSize) / 2;
		const float	approximatedTransferTime			= (theilSenFitting.offset + theilSenFitting.coefficient * (float)medianBufferSize) / 1000.0f / 1000.0f;
		const float	approximatedTransferTimeNoConstant	= (theilSenFitting.coefficient * (float)medianBufferSize) / 1000.0f / 1000.0f;
		const float	sampleLinearity						= calculateSampleFitLinearity(samples);
		const float	sampleTemporalStability				= calculateSampleTemporalStability(samples);

		approximatedTransferRateNoConstant				= (float)medianBufferSize / approximatedTransferTimeNoConstant;
		approximatedTransferRate						= (float)medianBufferSize / approximatedTransferTime;

		log	<< tcu::TestLog::Float("ResultLinearity", "Sample linearity", "%", QP_KEY_TAG_QUALITY, sampleLinearity * 100.0f)
			<< tcu::TestLog::Float("SampleTemporalStability", "Sample temporal stability", "%", QP_KEY_TAG_QUALITY, sampleTemporalStability * 100.0f)
			<< tcu::TestLog::Float("ApproximatedConstantCost", "Approximated contant cost", "us", QP_KEY_TAG_TIME, theilSenFitting.offset)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Lower", "Approximated contant cost 60% confidence lower limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceLower)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Upper", "Approximated contant cost 60% confidence upper limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceUpper)
			<< tcu::TestLog::Float("ApproximatedLinearCost", "Approximated linear cost", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficient * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Lower", "Approximated linear cost 60% confidence lower limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceLower * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Upper", "Approximated linear cost 60% confidence upper limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceUpper * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedTransferRate", "Approximated transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedTransferRate / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("ApproximatedTransferRateNoConstant", "Approximated transfer rate without constant cost", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedTransferRateNoConstant / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("SampleMedianTime", "Median sample time", "us", QP_KEY_TAG_TIME, resultStats.result.medianTime)
			<< tcu::TestLog::Float("SampleMedianTransfer", "Median transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, resultStats.medianRate / 1024.0f / 1024.0f);
	}

	// return approximated transfer rate
	{
		UploadSampleAnalyzeResult result;

		result.transferRateMedian = resultStats.medianRate;
		result.transferRateAtRange = approximatedTransferRate;
		result.transferRateAtInfinity = approximatedTransferRateNoConstant;

		return result;
	}
}